

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplaceRealloc<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *this,pointer pos,
          pair<unsigned_long,_unsigned_long> *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  long lVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  undefined8 uVar6;
  unsigned_long *puVar7;
  pointer ppVar8;
  long lVar9;
  long lVar10;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar10 = (long)pos - *(long *)this;
  puVar7 = (unsigned_long *)detail::allocArray(capacity,0x10);
  uVar5 = args->second;
  *(unsigned_long *)((long)puVar7 + lVar10) = args->first;
  ((unsigned_long *)((long)puVar7 + lVar10))[1] = uVar5;
  ppVar8 = *(pointer *)this;
  lVar3 = *(long *)(this + 8);
  puVar4 = puVar7;
  if (ppVar8 + lVar3 == pos) {
    if (lVar3 != 0) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ppVar8->first + lVar9);
        uVar6 = puVar1[1];
        *(undefined8 *)((long)puVar7 + lVar9) = *puVar1;
        ((undefined8 *)((long)puVar7 + lVar9))[1] = uVar6;
        lVar9 = lVar9 + 0x10;
      } while (lVar3 * 0x10 != lVar9);
    }
  }
  else {
    for (; ppVar8 != pos; ppVar8 = ppVar8 + 1) {
      uVar5 = ppVar8->second;
      *puVar4 = ppVar8->first;
      puVar4[1] = uVar5;
      puVar4 = puVar4 + 2;
    }
    ppVar8 = (pointer)(*(long *)(this + 8) * 0x10 + *(long *)this);
    if (ppVar8 != pos) {
      puVar4 = (unsigned_long *)((long)puVar7 + lVar10);
      do {
        uVar5 = pos->second;
        puVar4[2] = pos->first;
        puVar4[3] = uVar5;
        pos = pos + 1;
        puVar4 = puVar4 + 2;
      } while (pos != ppVar8);
    }
  }
  if (*(SmallVectorBase<std::pair<unsigned_long,unsigned_long>> **)this != this + 0x18) {
    free(*(SmallVectorBase<std::pair<unsigned_long,unsigned_long>> **)this);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(unsigned_long **)this = puVar7;
  return (pointer)((long)puVar7 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}